

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O2

bool __thiscall
rapidjson::internal::
GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::MatchRange(GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             *this,SizeType rangeIndex,uint codepoint)

{
  uint uVar1;
  Range *pRVar2;
  
  pRVar2 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetRange
                     (this->regex_,rangeIndex);
  uVar1 = pRVar2->start;
  do {
    if (rangeIndex == 0xffffffff) {
      return SUB41(uVar1 >> 0x1f,0);
    }
    pRVar2 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetRange
                       (this->regex_,rangeIndex);
    rangeIndex = pRVar2->next;
  } while ((codepoint < (pRVar2->start & 0x7fffffff)) || (pRVar2->end < codepoint));
  return -1 < (int)uVar1;
}

Assistant:

bool MatchRange(SizeType rangeIndex, unsigned codepoint) const {
        bool yes = (regex_.GetRange(rangeIndex).start & RegexType::kRangeNegationFlag) == 0;
        while (rangeIndex != kRegexInvalidRange) {
            const Range& r = regex_.GetRange(rangeIndex);
            if (codepoint >= (r.start & ~RegexType::kRangeNegationFlag) && codepoint <= r.end)
                return yes;
            rangeIndex = r.next;
        }
        return !yes;
    }